

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O3

string * __thiscall IR::Temp::type_abi_cxx11_(Temp *this)

{
  int iVar1;
  string *psVar2;
  
  if (type[abi:cxx11]()::kDefaultType_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&type[abi:cxx11]()::kDefaultType_abi_cxx11_);
    if (iVar1 != 0) {
      type[abi:cxx11]()::kDefaultType_abi_cxx11_._M_dataplus._M_p =
           (pointer)&type[abi:cxx11]()::kDefaultType_abi_cxx11_.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&type[abi:cxx11]()::kDefaultType_abi_cxx11_,"unsigned","");
      __cxa_atexit(std::__cxx11::string::~string,&type[abi:cxx11]()::kDefaultType_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&type[abi:cxx11]()::kDefaultType_abi_cxx11_);
    }
  }
  psVar2 = &type[abi:cxx11]()::kDefaultType_abi_cxx11_;
  if ((this->
      super_tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ).
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
      ._M_head_impl._M_string_length != 0) {
    psVar2 = &(this->
              super_tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ).
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
              ._M_head_impl;
  }
  return psVar2;
}

Assistant:

const std::string& type() const {
    static std::string kDefaultType{"unsigned"};
    const std::string& ty = std::get<0>(*this);
    return !ty.empty() ? ty : kDefaultType;
  }